

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpageranges.cpp
# Opt level: O2

QPageRanges __thiscall QPageRanges::fromString(QPageRanges *this,QString *ranges)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPageRangesPrivate *ptr;
  long lVar4;
  QString *this_00;
  long in_FS_OFFSET;
  bool ok_1;
  undefined3 uStack_a3;
  int local_a0;
  bool ok;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QPageRanges::Range> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (Range *)0x0;
  local_58.size = 0;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  QString::split(&local_78,ranges,0x2c,0,1);
  this_00 = (QString *)CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
  lVar4 = local_78.size * 0x18;
  do {
    if (lVar4 == 0) {
      (this->d).d.ptr = (QPageRangesPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QPageRanges(this);
      ptr = (QPageRangesPrivate *)operator_new(0x20);
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i = 0;
      (ptr->intervals).d.d = (Data *)0x0;
      (ptr->intervals).d.ptr = (Range *)0x0;
      (ptr->intervals).d.size = 0;
      QExplicitlySharedDataPointer<QPageRangesPrivate>::reset(&this->d,ptr);
      QArrayDataPointer<QPageRanges::Range>::operator=(&(((this->d).d.ptr)->intervals).d,&local_58);
      QPageRangesPrivate::mergeIntervals((this->d).d.ptr);
LAB_00364e40:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<QPageRanges::Range>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (QExplicitlySharedDataPointer<QPageRangesPrivate>)
               (QExplicitlySharedDataPointer<QPageRangesPrivate>)this;
      }
      __stack_chk_fail();
    }
    if ((this_00->d).size == 0) {
LAB_00364dde:
      QPageRanges(this);
      goto LAB_00364e40;
    }
    bVar1 = QString::contains(this_00,(QChar)0x2d,CaseSensitive);
    if (bVar1) {
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d._0_4_ = -0x55555556;
      local_98.d._4_4_ = -0x55555556;
      local_98.ptr._0_4_ = 0xaaaaaaaa;
      local_98.ptr._4_4_ = 0xaaaaaaaa;
      QString::split(&local_98,this_00,0x2d,0,1);
      if ((undefined1 *)local_98.size == (undefined1 *)0x2) {
        ok = true;
        iVar2 = QString::toInt((QString *)CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_),&ok,10);
        if (ok == true) {
          iVar3 = QString::toInt((QString *)(CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_) + 0x18)
                                 ,&ok,10);
          if ((((ok == true) && (iVar2 <= iVar3)) && (0 < iVar2)) && (0 < iVar3)) {
            _ok_1 = iVar2;
            local_a0 = iVar3;
            QList<QPageRanges::Range>::emplaceBack<QPageRanges::Range>
                      ((QList<QPageRanges::Range> *)&local_58,(Range *)&ok_1);
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
            goto LAB_00364db9;
          }
        }
      }
      QPageRanges(this);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
      goto LAB_00364e40;
    }
    _ok_1 = CONCAT31(uStack_a3,0xaa);
    iVar2 = QString::toInt(this_00,&ok_1,10);
    if ((iVar2 < 1) || (ok_1 == false)) goto LAB_00364dde;
    local_98.d._0_4_ = iVar2;
    local_98.d._4_4_ = iVar2;
    QList<QPageRanges::Range>::emplaceBack<QPageRanges::Range>
              ((QList<QPageRanges::Range> *)&local_58,(Range *)&local_98);
LAB_00364db9:
    this_00 = this_00 + 1;
    lVar4 = lVar4 + -0x18;
  } while( true );
}

Assistant:

QPageRanges QPageRanges::fromString(const QString &ranges)
{
    QList<Range> intervals;
    const QStringList items = ranges.split(u',');
    for (const QString &item : items) {
        if (item.isEmpty())
            return QPageRanges();

        if (item.contains(u'-')) {
            const QStringList rangeItems = item.split(u'-');
            if (rangeItems.size() != 2)
                return QPageRanges();

            bool ok;
            const int number1 = rangeItems[0].toInt(&ok);
            if (!ok)
                return QPageRanges();

            const int number2 = rangeItems[1].toInt(&ok);
            if (!ok)
                return QPageRanges();

            if (number1 < 1 || number2 < 1 || number2 < number1)
                return QPageRanges();

            intervals.append({number1, number2});

        } else {
            bool ok;
            const int number = item.toInt(&ok);
            if (!ok)
                return QPageRanges();

            if (number < 1)
                return QPageRanges();

            intervals.append({number, number});
        }
    }

    QPageRanges newRanges;
    newRanges.d.reset(new QPageRangesPrivate);
    newRanges.d->intervals = intervals;
    newRanges.d->mergeIntervals();
    return newRanges;
}